

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall>::reject
          (AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *this,
          Exception *exception)

{
  ExceptionOr<kj::Promise<void>_> local_1c0;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1c0,exception);
    local_1c0.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=(&this->result,&local_1c0);
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_1c0);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }